

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

UnicodeString * icu_63::appendMillis(UDate date,UnicodeString *str)

{
  int iVar1;
  bool bVar2;
  long local_88;
  int64_t number;
  undefined4 uStack_78;
  int32_t i;
  int32_t digits [20];
  UBool negative;
  UnicodeString *str_local;
  UDate date_local;
  
  if (-1.84303902528e+17 <= date) {
    if (date <= 1.838821689216e+17) {
      local_88 = (long)date;
    }
    else {
      local_88 = 0x28d47dbbf19b000;
    }
  }
  else {
    local_88 = -0x28ec76c40e65000;
  }
  bVar2 = local_88 < 0;
  if (bVar2) {
    local_88 = -local_88;
  }
  number._4_4_ = 0;
  iVar1 = number._4_4_;
  do {
    number._4_4_ = iVar1;
    (&uStack_78)[number._4_4_] = (int)(local_88 % 10);
    local_88 = local_88 / 10;
    iVar1 = number._4_4_ + 1;
  } while (local_88 != 0);
  if (bVar2) {
    UnicodeString::append(str,L'-');
  }
  while (-1 < number._4_4_) {
    UnicodeString::append(str,(short)(&uStack_78)[number._4_4_] + L'0');
    number._4_4_ = number._4_4_ + -1;
  }
  return str;
}

Assistant:

static UnicodeString& appendMillis(UDate date, UnicodeString& str) {
    UBool negative = FALSE;
    int32_t digits[20]; // max int64_t is 20 decimal digits
    int32_t i;
    int64_t number;

    if (date < MIN_MILLIS) {
        number = (int64_t)MIN_MILLIS;
    } else if (date > MAX_MILLIS) {
        number = (int64_t)MAX_MILLIS;
    } else {
        number = (int64_t)date;
    }
    if (number < 0) {
        negative = TRUE;
        number *= -1;
    }
    i = 0;
    do {
        digits[i++] = (int32_t)(number % 10);
        number /= 10;
    } while (number != 0);

    if (negative) {
        str.append(MINUS);
    }
    i--;
    while (i >= 0) {
        str.append((UChar)(digits[i--] + 0x0030));
    }
    return str;
}